

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastMultiplier3(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vRes)

{
  int Entry;
  Vec_Wec_t *vProds;
  Vec_Wec_t *vLevels;
  ulong uVar1;
  ulong uVar2;
  int Level;
  ulong uVar3;
  ulong uVar4;
  
  vProds = Vec_WecStart(nArgB + nArgA);
  vLevels = Vec_WecStart(nArgB + nArgA);
  uVar3 = 0;
  uVar4 = (ulong)(uint)nArgB;
  if (nArgB < 1) {
    uVar4 = uVar3;
  }
  uVar1 = (ulong)(uint)nArgA;
  if (nArgA < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      Entry = Gia_ManHashAnd(pNew,pArgA[uVar3],pArgB[uVar2]);
      Level = (int)uVar2 + (int)uVar3;
      Vec_WecPush(vProds,Level,Entry);
      Vec_WecPush(vLevels,Level,0);
    }
  }
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes);
  Vec_WecFree(vProds);
  Vec_WecFree(vLevels);
  return;
}

Assistant:

void Wlc_BlastMultiplier3( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( nArgA + nArgB );
    Vec_Wec_t * vLevels = Vec_WecStart( nArgA + nArgB );
    int i, k;
    for ( i = 0; i < nArgA; i++ )
        for ( k = 0; k < nArgB; k++ )
        {
            Vec_WecPush( vProds,  i+k, Gia_ManHashAnd(pNew, pArgA[i], pArgB[k]) );
            Vec_WecPush( vLevels, i+k, 0 );
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}